

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_intel.cc
# Opt level: O3

void OPENSSL_cpuid_setup(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  uint in_XCR0;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar12 = puVar1[1];
  uVar11 = puVar1[2];
  uVar4 = puVar1[3];
  if (uVar11 != 0x49656e69 || uVar12 != 0x756e6547) {
    bVar14 = uVar4 == 0x444d4163 && (uVar11 == 0x69746e65 && uVar12 == 0x68747541);
  }
  else {
    bVar14 = false;
  }
  bVar6 = uVar11 == 0x49656e69;
  bVar7 = uVar12 == 0x756e6547;
  uVar11 = 0;
  uVar12 = 0;
  if (6 < *puVar1) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar12 = *(uint *)(lVar2 + 4);
    uVar11 = *(uint *)(lVar2 + 0xc);
  }
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar3 = *puVar1;
  OPENSSL_ia32cap_P[1] = puVar1[3];
  uVar8 = uVar3 >> 8 & 0xf;
  uVar10 = uVar3 >> 0xc & 0xf0;
  uVar5 = (uVar3 >> 0x14 & 0xff) + 0xf;
  if (uVar8 != 0xf) {
    uVar5 = uVar8;
  }
  uVar13 = 0;
  if (uVar8 == 0xf) {
    uVar13 = uVar10;
  }
  if (uVar8 == 6) {
    uVar13 = uVar10;
  }
  if ((bVar14) && ((uVar5 < 0x17 || (uVar13 == 0x70 && uVar5 == 0x17)))) {
    OPENSSL_ia32cap_P[1] = OPENSSL_ia32cap_P[1] & 0xbfffffff;
  }
  if ((OPENSSL_ia32cap_P[1] >> 0x1b & 1) == 0) {
    in_XCR0 = 0;
  }
  else if ((~in_XCR0 & 6) == 0) goto LAB_001c7408;
  OPENSSL_ia32cap_P[1] = OPENSSL_ia32cap_P[1] & 0xefffe7ff;
  uVar12 = uVar12 & 0xffffffdf;
  uVar11 = uVar11 & 0xfffff9ff;
LAB_001c7408:
  OPENSSL_ia32cap_P[0] =
       puVar1[2] & 0xbfffffff | (uint)((bVar6 && bVar7) && uVar4 == 0x6c65746e) << 0x1e;
  uVar8 = uVar12 & 0x23dcffff;
  OPENSSL_ia32cap_P[3] = uVar11 & 0xffffa7bd;
  if ((~in_XCR0 & 0xe6) == 0) {
    uVar8 = uVar12;
    OPENSSL_ia32cap_P[3] = uVar11;
  }
  if (((((bVar6 && bVar7) && uVar4 == 0x6c65746e) && uVar5 == 6) &&
      (uVar12 = (uVar13 | uVar3 >> 4 & 0xf) - 0x55, uVar12 < 0x39)) &&
     ((0x180030000a00001U >> ((ulong)uVar12 & 0x3f) & 1) != 0)) {
    OPENSSL_ia32cap_P[2] = uVar8 | 0x4000;
  }
  else {
    OPENSSL_ia32cap_P[2] = uVar8 & 0xffffbfff;
  }
  pcVar9 = getenv("OPENSSL_ia32cap");
  if (pcVar9 != (char *)0x0) {
    handle_cpu_env(OPENSSL_ia32cap_P,pcVar9);
    pcVar9 = strchr(pcVar9,0x3a);
    if (pcVar9 != (char *)0x0) {
      handle_cpu_env(OPENSSL_ia32cap_P + 2,pcVar9 + 1);
      return;
    }
  }
  return;
}

Assistant:

void OPENSSL_cpuid_setup(void) {
  // Determine the vendor and maximum input value.
  uint32_t eax, ebx, ecx, edx;
  OPENSSL_cpuid(&eax, &ebx, &ecx, &edx, 0);

  uint32_t num_ids = eax;

  int is_intel = ebx == 0x756e6547 /* Genu */ && //
                 edx == 0x49656e69 /* ineI */ && //
                 ecx == 0x6c65746e /* ntel */;
  int is_amd = ebx == 0x68747541 /* Auth */ && //
               edx == 0x69746e65 /* enti */ && //
               ecx == 0x444d4163 /* cAMD */;

  uint32_t extended_features[2] = {0};
  if (num_ids >= 7) {
    OPENSSL_cpuid(&eax, &ebx, &ecx, &edx, 7);
    extended_features[0] = ebx;
    extended_features[1] = ecx;
  }

  OPENSSL_cpuid(&eax, &ebx, &ecx, &edx, 1);

  const uint32_t base_family = (eax >> 8) & 15;
  const uint32_t base_model = (eax >> 4) & 15;

  uint32_t family = base_family;
  uint32_t model = base_model;
  if (base_family == 15) {
    const uint32_t ext_family = (eax >> 20) & 255;
    family += ext_family;
  }
  if (base_family == 6 || base_family == 15) {
    const uint32_t ext_model = (eax >> 16) & 15;
    model |= ext_model << 4;
  }

  if (is_amd) {
    if (family < 0x17 || (family == 0x17 && 0x70 <= model && model <= 0x7f)) {
      // Disable RDRAND on AMD families before 0x17 (Zen) due to reported
      // failures after suspend.
      // https://bugzilla.redhat.com/show_bug.cgi?id=1150286
      // Also disable for family 0x17, models 0x70–0x7f, due to possible RDRAND
      // failures there too.
      ecx &= ~(1u << 30);
    }
  }

  // Reserved bit #30 is repurposed to signal an Intel CPU.
  if (is_intel) {
    edx |= (1u << 30);
  } else {
    edx &= ~(1u << 30);
  }

  uint64_t xcr0 = 0;
  if (ecx & (1u << 27)) {
    // XCR0 may only be queried if the OSXSAVE bit is set.
    xcr0 = OPENSSL_xgetbv(0);
  }
  // See Intel manual, volume 1, section 14.3.
  if ((xcr0 & 6) != 6) {
    // YMM registers cannot be used.
    ecx &= ~(1u << 28);                   // AVX
    ecx &= ~(1u << 12);                   // FMA
    ecx &= ~(1u << 11);                   // AMD XOP
    extended_features[0] &= ~(1u << 5);   // AVX2
    extended_features[1] &= ~(1u << 9);   // VAES
    extended_features[1] &= ~(1u << 10);  // VPCLMULQDQ
  }
  // See Intel manual, volume 1, sections 15.2 ("Detection of AVX-512 Foundation
  // Instructions") through 15.4 ("Detection of Intel AVX-512 Instruction Groups
  // Operating at 256 and 128-bit Vector Lengths").
  if (!os_supports_avx512(xcr0)) {
    // Without XCR0.111xx11x, no AVX512 feature can be used. This includes ZMM
    // registers, masking, SIMD registers 16-31 (even if accessed as YMM or
    // XMM), and EVEX-coded instructions (even on YMM or XMM). Even if only
    // XCR0.ZMM_Hi256 is missing, it isn't valid to use AVX512 features on
    // shorter vectors, since AVX512 ties everything to the availability of
    // 512-bit vectors. See the above-mentioned sections of the Intel manual,
    // which say that *all* these XCR0 bits must be checked even when just using
    // 128-bit or 256-bit vectors, and also volume 2a section 2.7.11 ("#UD
    // Equations for EVEX") which says that all EVEX-coded instructions raise an
    // undefined-instruction exception if any of these XCR0 bits is zero.
    extended_features[0] &= ~(1u << 16);  // AVX512F
    extended_features[0] &= ~(1u << 17);  // AVX512DQ
    extended_features[0] &= ~(1u << 21);  // AVX512IFMA
    extended_features[0] &= ~(1u << 26);  // AVX512PF
    extended_features[0] &= ~(1u << 27);  // AVX512ER
    extended_features[0] &= ~(1u << 28);  // AVX512CD
    extended_features[0] &= ~(1u << 30);  // AVX512BW
    extended_features[0] &= ~(1u << 31);  // AVX512VL
    extended_features[1] &= ~(1u << 1);   // AVX512VBMI
    extended_features[1] &= ~(1u << 6);   // AVX512VBMI2
    extended_features[1] &= ~(1u << 11);  // AVX512VNNI
    extended_features[1] &= ~(1u << 12);  // AVX512BITALG
    extended_features[1] &= ~(1u << 14);  // AVX512VPOPCNTDQ
  }

  // Repurpose the bit for the removed MPX feature to indicate when using zmm
  // registers should be avoided even when they are supported. (When set, AVX512
  // features can still be used, but only using ymm or xmm registers.) Skylake
  // suffered from severe downclocking when zmm registers were used, which
  // affected unrelated code running on the system, making zmm registers not too
  // useful outside of benchmarks. The situation improved significantly by Ice
  // Lake, but a small amount of downclocking remained. (See
  // https://lore.kernel.org/linux-crypto/e8ce1146-3952-6977-1d0e-a22758e58914@intel.com/)
  // We take a conservative approach of not allowing zmm registers until after
  // Ice Lake and Tiger Lake, i.e. until Sapphire Rapids on the server side.
  //
  // AMD CPUs, which support AVX512 starting with Zen 4, have not been reported
  // to have any downclocking problem when zmm registers are used.
  if (is_intel && family == 6 &&
      (model == 85 ||    // Skylake, Cascade Lake, Cooper Lake (server)
       model == 106 ||   // Ice Lake (server)
       model == 108 ||   // Ice Lake (micro server)
       model == 125 ||   // Ice Lake (client)
       model == 126 ||   // Ice Lake (mobile)
       model == 140 ||   // Tiger Lake (mobile)
       model == 141)) {  // Tiger Lake (client)
    extended_features[0] |= 1u << 14;
  } else {
    extended_features[0] &= ~(1u << 14);
  }

  OPENSSL_ia32cap_P[0] = edx;
  OPENSSL_ia32cap_P[1] = ecx;
  OPENSSL_ia32cap_P[2] = extended_features[0];
  OPENSSL_ia32cap_P[3] = extended_features[1];

  const char *env1, *env2;
  env1 = getenv("OPENSSL_ia32cap");
  if (env1 == NULL) {
    return;
  }

  // OPENSSL_ia32cap can contain zero, one or two values, separated with a ':'.
  // Each value is a 64-bit, unsigned value which may start with "0x" to
  // indicate a hex value. Prior to the 64-bit value, a '~' or '|' may be given.
  //
  // If the '~' prefix is present:
  //   the value is inverted and ANDed with the probed CPUID result
  // If the '|' prefix is present:
  //   the value is ORed with the probed CPUID result
  // Otherwise:
  //   the value is taken as the result of the CPUID
  //
  // The first value determines OPENSSL_ia32cap_P[0] and [1]. The second [2]
  // and [3].

  handle_cpu_env(&OPENSSL_ia32cap_P[0], env1);
  env2 = strchr(env1, ':');
  if (env2 != NULL) {
    handle_cpu_env(&OPENSSL_ia32cap_P[2], env2 + 1);
  }
}